

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O3

void embree::sse42::InstanceIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Instance *pIVar3;
  RTCRayQueryContext *pRVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pIVar3 = prim->instance;
  if ((((ray->super_RayK<1>).mask & (pIVar3->super_Geometry).mask) != 0) &&
     (pRVar4 = context->user, pRVar4->instID[0] == 0xffffffff)) {
    pRVar4->instID[0] = prim->instID_;
    pRVar4->instPrimID[0] = 0;
    fVar6 = (pIVar3->world2local0).l.vx.field_0.m128[0];
    fVar7 = (pIVar3->world2local0).l.vx.field_0.m128[1];
    fVar8 = (pIVar3->world2local0).l.vx.field_0.m128[2];
    fVar9 = (pIVar3->world2local0).l.vx.field_0.m128[3];
    fVar10 = (pIVar3->world2local0).l.vy.field_0.m128[0];
    fVar11 = (pIVar3->world2local0).l.vy.field_0.m128[1];
    fVar12 = (pIVar3->world2local0).l.vy.field_0.m128[2];
    fVar13 = (pIVar3->world2local0).l.vy.field_0.m128[3];
    fVar14 = (pIVar3->world2local0).l.vz.field_0.m128[0];
    fVar15 = (pIVar3->world2local0).l.vz.field_0.m128[1];
    fVar16 = (pIVar3->world2local0).l.vz.field_0.m128[2];
    fVar17 = (pIVar3->world2local0).l.vz.field_0.m128[3];
    aVar1 = (ray->super_RayK<1>).org.field_0.field_1;
    fVar21 = aVar1.x;
    fVar22 = aVar1.y;
    fVar23 = aVar1.z;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar24 = aVar2.x;
    fVar25 = aVar2.y;
    fVar26 = aVar2.z;
    auVar18._0_4_ =
         fVar21 * fVar6 +
         fVar22 * fVar10 + fVar23 * fVar14 + (pIVar3->world2local0).p.field_0.m128[0];
    auVar18._4_4_ =
         fVar21 * fVar7 +
         fVar22 * fVar11 + fVar23 * fVar15 + (pIVar3->world2local0).p.field_0.m128[1];
    auVar18._8_4_ =
         fVar21 * fVar8 +
         fVar22 * fVar12 + fVar23 * fVar16 + (pIVar3->world2local0).p.field_0.m128[2];
    auVar18._12_4_ =
         fVar21 * fVar9 +
         fVar22 * fVar13 + fVar23 * fVar17 + (pIVar3->world2local0).p.field_0.m128[3];
    aVar19.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar18,aVar1,8);
    (ray->super_RayK<1>).org.field_0 = aVar19;
    auVar20._0_4_ = fVar24 * fVar6 + fVar25 * fVar10 + fVar26 * fVar14;
    auVar20._4_4_ = fVar24 * fVar7 + fVar25 * fVar11 + fVar26 * fVar15;
    auVar20._8_4_ = fVar24 * fVar8 + fVar25 * fVar12 + fVar26 * fVar16;
    auVar20._12_4_ = fVar24 * fVar9 + fVar25 * fVar13 + fVar26 * fVar17;
    aVar19.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar20,aVar2,8);
    (ray->super_RayK<1>).dir.field_0 = aVar19;
    lVar5 = *(long *)&(pIVar3->super_Geometry).field_0x58;
    (**(code **)(lVar5 + 0x78))(lVar5 + 0x58,ray);
    local_38 = aVar1._0_8_;
    uStack_30 = aVar1._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_38;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_30;
    local_48 = aVar2._0_8_;
    uStack_40 = aVar2._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = local_48;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_40;
    pRVar4->instID[0] = 0xffffffff;
    pRVar4->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local();
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }